

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O2

void __thiscall
ninx::parser::element::VariableRead::VariableRead(VariableRead *this,string *name,int suffix_spaces)

{
  (this->super_Expression).super_Statement.super_ASTElement.parent = (Block *)0x0;
  (this->super_Expression).super_Statement.super_ASTElement.__output_block = (Block *)0x0;
  (this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__VariableRead_0014f228;
  std::__cxx11::string::string((string *)&this->name,(string *)name);
  this->trailing_spaces = suffix_spaces;
  return;
}

Assistant:

ninx::parser::element::VariableRead::VariableRead(const std::string &name, int suffix_spaces)
        : name(name), trailing_spaces(suffix_spaces) {}